

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_clear_state(nk_text_edit *state,nk_text_edit_type type,nk_plugin_filter filter)

{
  nk_vec2 nVar1;
  nk_plugin_filter filter_local;
  nk_text_edit_type type_local;
  nk_text_edit *state_local;
  
  (state->undo).undo_point = 0;
  (state->undo).undo_char_point = 0;
  (state->undo).redo_point = 99;
  (state->undo).redo_char_point = 999;
  state->select_start = 0;
  state->select_end = 0;
  state->cursor = 0;
  state->has_preferred_x = '\0';
  state->preferred_x = 0.0;
  state->cursor_at_end_of_line = '\0';
  state->initialized = '\x01';
  state->single_line = type == NK_TEXT_EDIT_SINGLE_LINE;
  state->mode = '\0';
  state->filter = filter;
  nVar1 = nk_vec2(0.0,0.0);
  state->scrollbar = nVar1;
  return;
}

Assistant:

NK_LIB void
nk_textedit_clear_state(struct nk_text_edit *state, enum nk_text_edit_type type,
    nk_plugin_filter filter)
{
    /* reset the state to default */
   state->undo.undo_point = 0;
   state->undo.undo_char_point = 0;
   state->undo.redo_point = NK_TEXTEDIT_UNDOSTATECOUNT;
   state->undo.redo_char_point = NK_TEXTEDIT_UNDOCHARCOUNT;
   state->select_end = state->select_start = 0;
   state->cursor = 0;
   state->has_preferred_x = 0;
   state->preferred_x = 0;
   state->cursor_at_end_of_line = 0;
   state->initialized = 1;
   state->single_line = (unsigned char)(type == NK_TEXT_EDIT_SINGLE_LINE);
   state->mode = NK_TEXT_EDIT_MODE_VIEW;
   state->filter = filter;
   state->scrollbar = nk_vec2(0,0);
}